

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::encodeField(JsonCodec *this,Field field,Reader *input,Builder output)

{
  HandlerBase *pHVar1;
  Builder BVar2;
  Impl *pIVar3;
  Type type;
  Reader local_f0;
  SegmentBuilder *local_98;
  CapTableBuilder *pCStack_90;
  void *local_88;
  WirePointer *pWStack_80;
  undefined8 local_78;
  Reader local_70;
  Maybe<capnp::JsonCodec::HandlerBase_*const_&> local_28;
  HandlerBase **local_20;
  HandlerBase **handler;
  Reader *input_local;
  JsonCodec *this_local;
  
  BVar2._builder = output._builder;
  handler = (HandlerBase **)input;
  input_local = (Reader *)this;
  pIVar3 = kj::Own<capnp::JsonCodec::Impl>::operator->(&this->impl);
  local_28 = kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
             find<capnp::StructSchema::Field&>
                       ((HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *)
                        &pIVar3->fieldHandlers,&field);
  local_20 = kj::_::readMaybe<capnp::JsonCodec::HandlerBase*const>(&local_28);
  if (local_20 == (HandlerBase **)0x0) {
    DynamicValue::Reader::Reader(&local_f0,input);
    type = StructSchema::Field::getType(&field);
    encode(this,&local_f0,type,output);
    DynamicValue::Reader::~Reader(&local_f0);
  }
  else {
    pHVar1 = *local_20;
    DynamicValue::Reader::Reader(&local_70,input);
    local_78._0_4_ = output._builder.dataSize;
    local_78._4_2_ = output._builder.pointerCount;
    local_78._6_2_ = output._builder._38_2_;
    output._builder.segment = BVar2._builder.segment;
    local_98 = output._builder.segment;
    pCStack_90 = output._builder.capTable;
    local_88 = output._builder.data;
    pWStack_80 = output._builder.pointers;
    (**pHVar1->_vptr_HandlerBase)(pHVar1,this,&local_70);
    DynamicValue::Reader::~Reader(&local_70);
  }
  return;
}

Assistant:

void JsonCodec::encodeField(StructSchema::Field field, DynamicValue::Reader input,
                            JsonValue::Builder output) const {
  KJ_IF_MAYBE(handler, impl->fieldHandlers.find(field)) {
    (*handler)->encodeBase(*this, input, output);
    return;
  }

  encode(input, field.getType(), output);
}